

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

void __thiscall HttpHeaderBase::HttpHeaderBase(HttpHeaderBase *this)

{
  HeaderField *local_28;
  HttpHeaderBase *this_local;
  
  this->_vptr_HttpHeaderBase = (_func_int **)&PTR__HttpHeaderBase_00147640;
  std::__cxx11::string::string((string *)&this->mHeaderStr);
  local_28 = this->mFields;
  do {
    HeaderField::HeaderField(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (HeaderField *)&this->mNumFields);
  this->mNumFields = 0;
  JetHead::list<FieldMap_*>::list(&this->mFieldMappings);
  std::__cxx11::string::reserve((ulong)&this->mHeaderStr);
  return;
}

Assistant:

HttpHeaderBase::HttpHeaderBase()
	:	mNumFields(0)
{
	mHeaderStr.reserve(kDefaultMessageSize);
}